

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellReissner4::UpdateNodalAndAveragePosAndOrientation
          (ChElementShellReissner4 *this)

{
  long lVar1;
  ChVector<double> *pCVar2;
  ChMatrix33<double> *pCVar3;
  long lVar4;
  Matrix<double,_3,_3,_1,_3,_3> *dst;
  ChMatrix33<double> T_avg;
  ChMatrix33<double> R_tilde_n [4];
  ChMatrix33<double> Tn [4];
  ChVector<double> local_2d8;
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_2c0 [72];
  ChMatrix33<double> local_278 [4];
  Matrix<double,_3,_3,_1,_3,_3> local_158 [4];
  
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setZero(local_2c0);
  pCVar2 = this->xa;
  pCVar3 = this->iTa;
  dst = local_158;
  for (lVar4 = 0; lVar4 != 0x40; lVar4 = lVar4 + 0x10) {
    lVar1 = *(long *)((long)&(((this->m_nodes).
                               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + lVar4);
    if (pCVar2 != (ChVector<double> *)(lVar1 + 0x20)) {
      pCVar2->m_data[0] = *(double *)(lVar1 + 0x20);
      pCVar2->m_data[1] = *(double *)(lVar1 + 0x28);
      pCVar2->m_data[2] = *(double *)(lVar1 + 0x30);
    }
    local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(lVar1 + 0x58);
    local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)pCVar3;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              (dst,(Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                    *)local_278);
    local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
         (double)(*(long *)((long)&(((this->m_nodes).
                                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr + lVar4) + 0x58);
    local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
         (double)pCVar3;
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_2c0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)local_278);
    dst = dst + 1;
    pCVar3 = pCVar3 + 1;
    pCVar2 = pCVar2 + 1;
  }
  local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.25;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator*=(local_2c0,(Scalar *)local_278)
  ;
  rotutils::VecRot(&local_2d8,(ChMatrix33<double> *)local_2c0);
  rotutils::Rot(local_278,&local_2d8);
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  (this->T_overline).super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  pCVar2 = this->phi_tilde_n;
  for (lVar4 = 0; lVar4 != 0x120; lVar4 = lVar4 + 0x48) {
    pCVar3 = (ChMatrix33<double> *)
             ((long)local_278[0].super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array + lVar4);
    local_2d8.m_data[1] =
         (double)((long)local_158[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                        m_storage.m_data.array + lVar4);
    local_2d8.m_data[0] = (double)&this->T_overline;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((Matrix<double,_3,_3,_1,_3,_3> *)pCVar3,
               (Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
                *)&local_2d8);
    rotutils::VecRot(&local_2d8,pCVar3);
    if (pCVar2 != &local_2d8) {
      pCVar2->m_data[0] = local_2d8.m_data[0];
      pCVar2->m_data[1] = local_2d8.m_data[1];
      pCVar2->m_data[2] = local_2d8.m_data[2];
    }
    pCVar2 = pCVar2 + 1;
  }
  return;
}

Assistant:

void ChElementShellReissner4::UpdateNodalAndAveragePosAndOrientation() {
    ChMatrix33<> Tn[NUMNODES];
    ChMatrix33<> T_avg;
    T_avg.setZero();
    for (int i = 0; i < NUMNODES; i++) {
        xa[i] = this->m_nodes[i]->GetPos();
        Tn[i] = this->m_nodes[i]->GetA() * iTa[i];
        T_avg += this->m_nodes[i]->GetA() * iTa[i];  //***TODO*** use predicted rot?
    }
    T_avg *= 0.25;
    T_overline = rotutils::Rot(rotutils::VecRot(T_avg));
    /*
        // ***ALEX*** test an alternative for T_overline:
        // average four rotations with quaternion averaging:
        ChQuaternion<> qTa = Tn[0].Get_A_quaternion();
        ChQuaternion<> qTb = Tn[1].Get_A_quaternion();
        if ( (qTa ^ qTb) < 0)
            qTb *= -1;
        ChQuaternion<> qTc = Tn[2].Get_A_quaternion();
        if ( (qTa ^ qTc) < 0)
            qTc *= -1;
        ChQuaternion<> qTd = Tn[3].Get_A_quaternion();
        if ( (qTa ^ qTd) < 0)
            qTd *= -1;
        ChQuaternion<> Tavg =(qTa + qTb + qTc + qTd ).GetNormalized();
        T_overline.Set_A_quaternion(Tavg);
    */

    ChMatrix33<> R_tilde_n[NUMNODES];
    for (int i = 0; i < NUMNODES; i++) {
        R_tilde_n[i] = T_overline.transpose() * Tn[i];
        phi_tilde_n[i] = rotutils::VecRot(R_tilde_n[i]);
        // if (phi_tilde_n[i].Length()*CH_C_RAD_TO_DEG > 15)
        //    GetLog() << "WARNING phi_tilde_n[" << i << "]=" <<  phi_tilde_n[i].Length()*CH_C_RAD_TO_DEG << "�\n";
    }
}